

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

int set_insert_array(set s,set_key *keys,set_value *values,size_t size)

{
  int iVar1;
  size_t sVar2;
  char *message;
  
  if (values == (set_value *)0x0 || (keys == (set_key *)0x0 || s == (set)0x0)) {
    message = "Invalid set array insertion parameters";
    sVar2 = 0xef;
  }
  else {
    sVar2 = 0;
    do {
      if (size == sVar2) {
        return 0;
      }
      iVar1 = set_insert(s,keys[sVar2],values[sVar2]);
      sVar2 = sVar2 + 1;
    } while (iVar1 == 0);
    message = "Invalid set array insertion";
    sVar2 = 0xf7;
  }
  log_write_impl_va("metacall",sVar2,"set_insert_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                    ,LOG_LEVEL_ERROR,message);
  return 1;
}

Assistant:

int set_insert_array(set s, set_key keys[], set_value values[], size_t size)
{
	size_t iterator;

	if (s == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set array insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (set_insert(s, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid set array insertion");
			return 1;
		}
	}

	return 0;
}